

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O0

deBool qpXmlWriter_startDocument(qpXmlWriter *writer)

{
  qpXmlWriter *writer_local;
  
  writer->xmlIsWriting = 1;
  writer->xmlElementDepth = 0;
  writer->xmlPrevIsStartElement = 0;
  fprintf((FILE *)writer->outputFile,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  return 1;
}

Assistant:

deBool qpXmlWriter_startDocument (qpXmlWriter* writer)
{
	DE_ASSERT(writer && !writer->xmlIsWriting);
	writer->xmlIsWriting			= DE_TRUE;
	writer->xmlElementDepth			= 0;
	writer->xmlPrevIsStartElement	= DE_FALSE;
	fprintf(writer->outputFile, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
	return DE_TRUE;
}